

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O3

void __thiscall
pstore::storage::storage<pstore::file::in_memory>
          (storage *this,shared_ptr<pstore::file::in_memory> *file,
          unique_ptr<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
          *page_size,
          unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
          *region_factory)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> __s;
  pointer *__ptr;
  
  __s._M_head_impl = (array<pstore::sat_entry,_65536UL> *)operator_new(0x200000);
  memset(__s._M_head_impl,0,0x200000);
  (this->sat_)._M_t.
  super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
       __s._M_head_impl;
  (this->file_).super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((file->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_file_base;
  p_Var1 = (file->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->file_).super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->page_size_)._M_t.
  super___uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
  .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl =
       (page_size->_M_t).
       super___uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
       ._M_t.
       super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
       .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl;
  (page_size->_M_t).
  super___uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
  .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl =
       (system_page_size_interface *)0x0;
  (this->region_factory_)._M_t.
  super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>._M_t
  .super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>.
  super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl =
       (region_factory->_M_t).
       super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
       ._M_t.
       super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
       .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl;
  (region_factory->_M_t).
  super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>._M_t
  .super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>.
  super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl = (factory *)0x0;
  (*((this->region_factory_)._M_t.
     super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>.
     _M_t.
     super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
     .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl)->_vptr_factory[2])
            (&this->regions_);
  return;
}

Assistant:

storage (std::shared_ptr<File> const & file,
                 std::unique_ptr<system_page_size_interface> && page_size,
                 std::unique_ptr<region::factory> && region_factory)
                : file_{std::static_pointer_cast<file::file_base> (file)}
                , page_size_{std::move (page_size)}
                , region_factory_{std::move (region_factory)}
                , regions_{region_factory_->init ()} {}